

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

ostream * std::operator<<(ostream *o,Function *func)

{
  undefined1 local_1a8 [8];
  PrintSExpression print;
  
  ::wasm::PrintSExpression::PrintSExpression((PrintSExpression *)local_1a8,o);
  print.o._4_1_ = 0;
  print._8_8_ = (long)
                "\n  var scratchBuffer = new ArrayBuffer(16);\n  var i32ScratchView = new Int32Array(scratchBuffer);\n  var f32ScratchView = new Float32Array(scratchBuffer);\n  var f64ScratchView = new Float64Array(scratchBuffer);\n  "
                + 0xd3;
  print.maybeSpace = "\n";
  print.lastPrintedLocation.super__Optional_base<wasm::Function::DebugLocation,_true,_true>.
  _M_payload.super__Optional_payload_base<wasm::Function::DebugLocation>._M_payload._M_value.
  symbolNameIndex.super__Optional_base<unsigned_int,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_int>._M_engaged = false;
  ::wasm::PrintSExpression::visitFunction((PrintSExpression *)local_1a8,func);
  ::wasm::PrintSExpression::~PrintSExpression((PrintSExpression *)local_1a8);
  return o;
}

Assistant:

std::ostream& operator<<(std::ostream& o, wasm::Function& func) {
  wasm::PrintSExpression print(o);
  print.setMinify(false);
  print.setDebugInfo(false);
  print.visitFunction(&func);
  return o;
}